

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::AggressiveDCEPass::AddDebugScopeToWorkList(AggressiveDCEPass *this,Instruction *inst)

{
  DebugScope DVar1;
  IRContext *pIVar2;
  Instruction *pIVar3;
  
  DVar1 = inst->dbg_scope_;
  if (DVar1.lexical_scope_ != 0) {
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pIVar3 = analysis::DefUseManager::GetDef
                       ((pIVar2->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,DVar1.lexical_scope_);
    AddToWorklist(this,pIVar3);
  }
  if ((ulong)DVar1 >> 0x20 == 0) {
    return;
  }
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar2->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,DVar1.inlined_at_);
  AddToWorklist(this,pIVar3);
  return;
}

Assistant:

void AggressiveDCEPass::AddDebugScopeToWorkList(const Instruction* inst) {
  auto scope = inst->GetDebugScope();
  auto lex_scope_id = scope.GetLexicalScope();
  if (lex_scope_id != kNoDebugScope)
    AddToWorklist(get_def_use_mgr()->GetDef(lex_scope_id));
  auto inlined_at_id = scope.GetInlinedAt();
  if (inlined_at_id != kNoInlinedAt)
    AddToWorklist(get_def_use_mgr()->GetDef(inlined_at_id));
}